

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATrie.cpp
# Opt level: O3

long __thiscall DNANode::find(DNANode *this,Base *dna,size_t size)

{
  size_t sVar1;
  
  if (size != 0) {
    sVar1 = 0;
    do {
      this = this->childNodes[dna[sVar1]];
      if (this == (DNANode *)0x0) {
        return -1;
      }
      sVar1 = sVar1 + 1;
    } while (size != sVar1);
  }
  return this->count;
}

Assistant:

long DNANode::find(const DNA::Base* dna, size_t size)
{
    if (!size)
        return count;
    DNANode* nextNode = childNodes[*dna];
    if (nextNode == nullptr)
        return -1;
    else
        return nextNode->find(dna + 1, size - 1);
}